

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDMeshFragment * __thiscall
ON_SubDMeshFragmentIterator::FirstFragment(ON_SubDMeshFragmentIterator *this)

{
  element_type *peVar1;
  ON_SubDMeshFragment *pOVar2;
  ON_SubDFace *this_00;
  
  if (this->m_bFromFaceFragments == true) {
    this->m_current_fragment = (ON_SubDMeshFragment *)0x0;
    (this->m_fit).m_face_index = 0;
    this_00 = (this->m_fit).m_face_first;
    (this->m_fit).m_face_current = this_00;
    while (this_00 != (ON_SubDFace *)0x0) {
      pOVar2 = ON_SubDFace::MeshFragments(this_00);
      this->m_current_fragment = pOVar2;
      if (pOVar2 != (ON_SubDMeshFragment *)0x0) {
        return pOVar2;
      }
      this_00 = ON_SubDFaceIterator::NextFace(&this->m_fit);
    }
    pOVar2 = this->m_current_fragment;
  }
  else {
    peVar1 = (this->m_limit_mesh).m_impl_sp.
             super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      pOVar2 = (ON_SubDMeshFragment *)0x0;
    }
    else {
      pOVar2 = peVar1->m_first_fragment;
    }
    this->m_current_fragment = pOVar2;
  }
  return pOVar2;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragmentIterator::FirstFragment()
{
  if (m_bFromFaceFragments)
  {
    m_current_fragment = nullptr;
    for (const ON_SubDFace* f = m_fit.FirstFace(); nullptr != f; f = m_fit.NextFace())
    {
      m_current_fragment = f->MeshFragments();
      if (nullptr != m_current_fragment)
        break;
    }
  }
  else
  {
    m_current_fragment = m_limit_mesh.FirstFragment();
  }
  return m_current_fragment;
}